

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

void __thiscall OpenMD::FragmentStamp::checkAtoms(FragmentStamp *this)

{
  bool bVar1;
  ostream *poVar2;
  OpenMDException *this_00;
  difference_type dVar3;
  string *msg;
  undefined8 uVar4;
  ostringstream oss;
  iterator ai;
  FragmentStamp *in_stack_fffffffffffffdb8;
  __normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
  *in_stack_fffffffffffffdc0;
  AtomStamp **in_stack_fffffffffffffdc8;
  __normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
  in_stack_fffffffffffffdd0;
  __normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
  in_stack_fffffffffffffdd8;
  string local_1d8 [48];
  ostringstream local_1a8 [376];
  AtomStamp **local_30;
  undefined8 local_28;
  AtomStamp **local_20;
  AtomStamp **local_18;
  AtomStamp **local_10;
  
  local_18 = (AtomStamp **)
             std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::begin
                       ((vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *)
                        in_stack_fffffffffffffdb8);
  local_20 = (AtomStamp **)
             std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::end
                       ((vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *)
                        in_stack_fffffffffffffdb8);
  local_28 = 0;
  local_10 = (AtomStamp **)
             std::
             find<__gnu_cxx::__normal_iterator<OpenMD::AtomStamp**,std::vector<OpenMD::AtomStamp*,std::allocator<OpenMD::AtomStamp*>>>,OpenMD::AtomStamp*>
                       (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                        in_stack_fffffffffffffdc8);
  local_30 = (AtomStamp **)
             std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::end
                       ((vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *)
                        in_stack_fffffffffffffdb8);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_fffffffffffffdc0,
                     (__normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
                      *)in_stack_fffffffffffffdb8);
  if (!bVar1) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"Error in Fragment ");
  getName_abi_cxx11_(in_stack_fffffffffffffdb8);
  poVar2 = std::operator<<(poVar2,local_1d8);
  this_00 = (OpenMDException *)std::operator<<(poVar2,": atom[");
  std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::begin
            ((vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *)
             in_stack_fffffffffffffdb8);
  dVar3 = __gnu_cxx::operator-
                    (in_stack_fffffffffffffdc0,
                     (__normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
                      *)in_stack_fffffffffffffdb8);
  msg = (string *)std::ostream::operator<<(this_00,dVar3);
  std::operator<<((ostream *)msg,"] is missing\n");
  std::__cxx11::string::~string(local_1d8);
  uVar4 = __cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(this_00,msg);
  __cxa_throw(uVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void FragmentStamp::checkAtoms() {
    std::vector<AtomStamp*>::iterator ai = std::find(
        atomStamps_.begin(), atomStamps_.end(), static_cast<AtomStamp*>(NULL));
    if (ai != atomStamps_.end()) {
      std::ostringstream oss;
      oss << "Error in Fragment " << getName() << ": atom["
          << ai - atomStamps_.begin() << "] is missing\n";
      throw OpenMDException(oss.str());
    }
  }